

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# water.cpp
# Opt level: O0

shared_ptr<Image> runEnhanceStage(Image *previous,Histogram *hist,WaterEffectOptions *options)

{
  int iVar1;
  runtime_error *this;
  element_type *this_00;
  long in_RCX;
  Image *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  Image *in_RSI;
  element_type *in_RDI;
  shared_ptr<Image> sVar3;
  shared_ptr<Image> enhanced_hist_img;
  Histogram enhanced_hist;
  int threshold;
  shared_ptr<Image> *img_enhanced;
  string *in_stack_fffffffffffffea8;
  Image *in_stack_fffffffffffffeb0;
  element_type *in_stack_fffffffffffffeb8;
  undefined8 in_stack_fffffffffffffec8;
  Histogram *in_stack_fffffffffffffed0;
  uint *in_stack_fffffffffffffed8;
  Image *pIVar4;
  Image *in_stack_fffffffffffffee0;
  Image *dest;
  Image *src;
  Image *src_00;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 uVar5;
  string local_e8 [12];
  uint in_stack_ffffffffffffff24;
  Histogram *in_stack_ffffffffffffff28;
  string local_c8 [80];
  string local_78 [32];
  string local_58 [39];
  undefined1 local_31;
  int local_30;
  long local_20;
  undefined8 local_18;
  Image *local_10;
  
  if (((*(byte *)(in_RCX + 0x28) & 1) != 0) && (in_RDX != (Image *)0x0)) {
    uVar5 = 0;
    local_20 = in_RCX;
    local_18 = in_RDX;
    local_10 = in_RSI;
    iVar1 = Histogram::max(in_stack_fffffffffffffed0,(int)((ulong)in_stack_fffffffffffffec8 >> 0x20)
                          );
    local_30 = (int)((double)iVar1 * 0.1);
    local_31 = 0;
    std::make_shared<Image,unsigned_int_const&,unsigned_int_const&>
              (in_stack_fffffffffffffed8,(uint *)in_stack_fffffffffffffed0);
    iVar1 = (int)((ulong)in_stack_fffffffffffffed0 >> 0x20);
    src = local_10;
    src_00 = local_18;
    std::__shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>::get
              ((__shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2> *)in_RDI);
    enhanceContrastLinearly
              (src_00,(Histogram *)src,in_stack_fffffffffffffee0,
               (int)((ulong)in_stack_fffffffffffffed8 >> 0x20),(int)in_stack_fffffffffffffed8,iVar1)
    ;
    pIVar4 = local_10;
    dest = local_18;
    std::__shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>::get
              ((__shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2> *)in_RDI);
    enhanceContrastLinearly
              (src_00,(Histogram *)src,dest,(int)((ulong)pIVar4 >> 0x20),(int)pIVar4,iVar1);
    std::__shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>::get
              ((__shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2> *)in_RDI);
    enhanceContrastLinearly
              (src_00,(Histogram *)src,dest,(int)((ulong)pIVar4 >> 0x20),(int)pIVar4,local_18._4_4_)
    ;
    std::__shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>::get
              ((__shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2> *)in_RDI);
    copyChannel(local_10,in_stack_fffffffffffffeb8,(int)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
    if ((*(byte *)(local_20 + 0x30) & 1) != 0) {
      in_stack_fffffffffffffeb8 =
           std::__shared_ptr_access<Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Image,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x11fb7f);
      std::operator+((char *)CONCAT44(uVar5,in_stack_fffffffffffffef8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)src_00);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffeb8,(char *)in_stack_fffffffffffffeb0);
      Image::toPNG(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      std::__cxx11::string::~string(local_58);
      std::__cxx11::string::~string(local_78);
    }
    local_10 = std::__shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>::get
                         ((__shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2> *)in_RDI);
    _Var2._M_pi = extraout_RDX;
    if ((*(byte *)(local_20 + 0x2a) & 1) != 0) {
      std::__shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>::get
                ((__shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2> *)in_RDI);
      getHistogram(src);
      Histogram::toImage(in_stack_ffffffffffffff28,in_stack_ffffffffffffff24);
      this_00 = std::__shared_ptr_access<Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<Image,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                           0x11fcbb);
      std::operator+((char *)CONCAT44(uVar5,in_stack_fffffffffffffef8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)src_00);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffeb8,(char *)this_00);
      Image::toPNG(this_00,in_stack_fffffffffffffea8);
      std::__cxx11::string::~string(local_c8);
      std::__cxx11::string::~string(local_e8);
      std::shared_ptr<Image>::~shared_ptr((shared_ptr<Image> *)0x11fd2e);
      Histogram::~Histogram((Histogram *)0x11fd3b);
      _Var2._M_pi = extraout_RDX_00;
    }
    sVar3.super___shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
    sVar3.super___shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
    return (shared_ptr<Image>)sVar3.super___shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this,"Contrast enhancement is only possible when histogram stage has been performed.");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::shared_ptr<Image> runEnhanceStage(const Image *previous,
                                       const Histogram *hist,
                                       const WaterEffectOptions *options) {
  // Check if histogram stage has been properly executed.
  if ((!options->histogram) || (hist == nullptr)) {
    throw std::runtime_error("Contrast enhancement is only possible when histogram stage has been performed.");
  }

  // Determine the threshold from the histogram, by taking 10% of the maximum value in the histogram.
  auto threshold = (int) (hist->max(0) * 0.1);

  // Create a new image to store the result
  auto img_enhanced = std::make_shared<Image>(previous->width, previous->height);

  // Enhance the contrast on the color channels
  enhanceContrastLinearly(previous, hist, img_enhanced.get(), threshold, threshold, 0);
  enhanceContrastLinearly(previous, hist, img_enhanced.get(), threshold, threshold, 1);
  enhanceContrastLinearly(previous, hist, img_enhanced.get(), threshold, threshold, 2);

  // Copy over the alpha channel
  copyChannel(previous, img_enhanced.get(), 3);

  // Save the resulting image
  if (options->save_intermediate)
    img_enhanced->toPNG("output/" + options->img_name + "_enhanced.png");

  // Set the previous image to point to the enhanced image for next stages.
  previous = img_enhanced.get();

  // Create and save the enhanced histogram (if enabled).
  if (options->enhance_hist) {
    auto enhanced_hist = getHistogram(img_enhanced.get());
    auto enhanced_hist_img = enhanced_hist.toImage();
    enhanced_hist_img->toPNG("output/" + options->img_name + "_enhanced_histogram.png");
  }

  return img_enhanced;
}